

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O1

void Hacl_Bignum25519_fmul(uint64_t *out,uint64_t *a,uint64_t *b)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong uVar54;
  undefined1 auVar55 [16];
  ulong uVar56;
  uint64_t yi_2;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  uint64_t yi;
  uint64_t yi_1;
  uint64_t yi_7;
  uint64_t yi_9;
  uint64_t yi_5;
  uint64_t yi_6;
  
  uVar58 = a[2];
  uVar59 = *a;
  uVar56 = a[1];
  uVar1 = *b;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar59;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar56;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar58;
  uVar2 = a[3];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = a[4];
  uVar54 = a[4] * 0x13;
  uVar1 = b[1];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar54;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar59;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar56;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar58;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar2;
  uVar2 = uVar2 * 0x13;
  uVar1 = b[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar54;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar59;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar56;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar58;
  uVar1 = b[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar58 * 0x13;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar54;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar1;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar59;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar56;
  uVar1 = b[4];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar1;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar56 * 0x13;
  auVar3 = auVar18 * auVar43 + auVar13 * auVar38 + auVar8 * auVar33 + auVar3 * auVar28 +
           auVar23 * auVar48;
  uVar57 = auVar3._0_8_;
  uVar56 = auVar3._8_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar1;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar58 * 0x13;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar1;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar54;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar1;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar59;
  auVar55._8_8_ = uVar56 >> 0x33;
  auVar55._0_8_ = uVar56 * 0x2000 | uVar57 >> 0x33;
  auVar55 = auVar24 * auVar49 +
            auVar19 * auVar44 + auVar9 * auVar34 + auVar4 * auVar29 + auVar14 * auVar39 + auVar55;
  auVar3 = auVar25 * auVar50 +
           auVar20 * auVar45 + auVar15 * auVar40 + auVar5 * auVar30 + auVar10 * auVar35 +
           (auVar55 >> 0x33);
  auVar4 = (auVar3 >> 0x33) +
           auVar26 * auVar51 +
           auVar16 * auVar41 + auVar6 * auVar31 + auVar11 * auVar36 + auVar21 * auVar46;
  uVar56 = auVar4._0_8_;
  uVar58 = auVar4._8_8_;
  auVar53._8_8_ = uVar58 >> 0x33;
  auVar53._0_8_ = uVar58 * 0x2000 | uVar56 >> 0x33;
  auVar53 = auVar22 * auVar47 + auVar17 * auVar42 + auVar7 * auVar32 + auVar12 * auVar37 +
            auVar27 * auVar52 + auVar53;
  uVar59 = auVar53._0_8_;
  uVar58 = (auVar53._8_8_ << 0xd | uVar59 >> 0x33) * 0x13 + (uVar57 & 0x7ffffffffffff);
  out[2] = auVar3._0_8_ & 0x7ffffffffffff;
  out[3] = uVar56 & 0x7ffffffffffff;
  out[4] = uVar59 & 0x7ffffffffffff;
  *out = uVar58 & 0x7ffffffffffff;
  out[1] = (uVar58 >> 0x33) + (auVar55._0_8_ & 0x7ffffffffffff);
  return;
}

Assistant:

static void Hacl_Bignum25519_fmul(uint64_t *out, uint64_t *a, uint64_t *b)
{
  Hacl_Bignum_fmul(out, a, b);
}